

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

void __thiscall
helics::ValueFederateManager::addTarget(ValueFederateManager *this,Input *inp,string_view target)

{
  InterfaceHandle *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueFederate *pVVar2;
  _func_int *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
  *p_Var5;
  handle *phVar6;
  int iVar7;
  _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char *__s1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Base_ptr __n;
  undefined8 uVar11;
  size_type __rlen;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar12;
  string_view message;
  handle iTHandle;
  handle local_108;
  undefined8 uStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Input *local_88;
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  *local_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  handle local_48;
  
  __s1 = target._M_str;
  __n = (_Base_ptr)target._M_len;
  local_80 = &this->inputTargets;
  local_78._M_len = (size_t)__n;
  local_78._M_str = __s1;
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock(&local_48,local_80);
  __k = &(inp->super_Interface).handle;
  local_88 = inp;
  pVar12 = std::
           _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::equal_range(&(local_48.data)->_M_t,__k);
  _Var8 = pVar12.first._M_node;
  do {
    if (_Var8._M_node == pVar12.second._M_node._M_node) {
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
      (*this->coreObject->_vptr_Core[0x3e])(this->coreObject,(ulong)(uint)__k->hid,__n,__s1,0x75);
      gmlc::libguarded::
      shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
      ::lock(&local_108,local_80);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
      ::
      _M_emplace_equal<helics::InterfaceHandle_const&,std::basic_string_view<char,std::char_traits<char>>&>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                  *)local_108.data,__k,&local_78);
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_108.m_handle_lock);
      gmlc::libguarded::
      shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
      ::lock((handle *)&local_108,&this->targetIDs);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
      ::
      _M_emplace_equal<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                  *)local_108.data,&local_78,__k);
      phVar6 = &local_108;
LAB_001f82b1:
      std::unique_lock<std::shared_mutex>::~unique_lock(&phVar6->m_handle_lock);
      return;
    }
    if ((_Var8._M_node[1]._M_left == __n) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar7 = bcmp(__s1,_Var8._M_node[1]._M_parent,(size_t)__n), iVar7 == 0)))) {
      pVVar2 = this->fed;
      p_Var3 = pVVar2->_vptr_ValueFederate[-3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Duplicate input targets detected for ","");
      iVar7 = (*(local_88->super_Interface)._vptr_Interface[4])();
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_68,*(char **)CONCAT44(extraout_var,iVar7),
                           ((undefined8 *)CONCAT44(extraout_var,iVar7))[1]);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if (paVar4 == paVar10) {
        local_a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      }
      else {
        local_a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_a8._M_dataplus._M_p = (pointer)paVar4;
      }
      local_a8._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_a8,"::");
      paVar4 = &local_e8.field_2;
      local_e8._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == paVar10) {
        local_e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_e8.field_2._8_4_ = *(undefined4 *)((long)&pbVar9->field_2 + 8);
        local_e8.field_2._12_4_ = *(undefined4 *)((long)&pbVar9->field_2 + 0xc);
        local_e8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_e8._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      paVar10 = &local_c8.field_2;
      local_c8._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,__s1,__s1 + (long)&__n->_M_color);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar4) {
        uVar11 = local_e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_c8._M_string_length + local_e8._M_string_length) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar10) {
          uVar11 = local_c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_c8._M_string_length + local_e8._M_string_length)
        goto LAB_001f81b1;
        pbVar9 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_c8,0,0,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      }
      else {
LAB_001f81b1:
        pbVar9 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                           (&local_e8,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      }
      local_108.data = (pointer)&local_108.m_handle_lock._M_owns;
      p_Var5 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                *)(pbVar9->_M_dataplus)._M_p;
      paVar1 = &pbVar9->field_2;
      if (p_Var5 == (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                     *)paVar1) {
        local_108.m_handle_lock._8_8_ = paVar1->_M_allocated_capacity;
        uStack_f0 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      }
      else {
        local_108.m_handle_lock._8_8_ = paVar1->_M_allocated_capacity;
        local_108.data = (pointer)p_Var5;
      }
      local_108.m_handle_lock._M_device = (mutex_type *)pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar9->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      message._M_str = (char *)local_108.data;
      message._M_len = (size_t)local_108.m_handle_lock._M_device;
      Federate::logMessage
                ((Federate *)((long)&pVVar2->_vptr_ValueFederate + (long)p_Var3),3,message);
      if (local_108.data != (pointer)&local_108.m_handle_lock._M_owns) {
        operator_delete(local_108.data,local_108.m_handle_lock._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar10) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar4) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      phVar6 = &local_48;
      goto LAB_001f82b1;
    }
    _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node);
  } while( true );
}

Assistant:

void ValueFederateManager::addTarget(const Input& inp, std::string_view target)
{
    {
        auto iTHandle = inputTargets.lock();
        auto rng = iTHandle->equal_range(inp.handle);
        for (auto el = rng.first; el != rng.second; ++el) {
            if (el->second == target) {
                fed->logWarningMessage(std::string("Duplicate input targets detected for ") +
                                       inp.getDisplayName() + "::" + std::string(target));
                return;
            }
        }
    }

    coreObject->addSourceTarget(inp.handle, target);

    inputTargets.lock()->emplace(inp.handle, target);
    targetIDs.lock()->emplace(target, inp.handle);
}